

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

void __thiscall httplib::Response::~Response(Response *this)

{
  bool bVar1;
  Response *this_local;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)&this->content_provider_resource_releaser_);
  if (bVar1) {
    std::function<void_()>::operator()(&this->content_provider_resource_releaser_);
  }
  std::function<void_()>::~function(&this->content_provider_resource_releaser_);
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::~function
            (&this->content_provider_);
  std::__cxx11::string::~string((string *)&this->location);
  std::__cxx11::string::~string((string *)&this->body);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap(&this->headers);
  std::__cxx11::string::~string((string *)&this->reason);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Response() {
            if (content_provider_resource_releaser_) {
                content_provider_resource_releaser_();
            }
        }